

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O1

void dw4_hero(dw_rom *rom)

{
  vpatch(rom,0x13b4,0x4f,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0,0x51,0,0x52,
         0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,
         0,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50);
  vpatch(rom,0x14b4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14d4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14f4,0xd,0x48,0,0xa9,3,0x4a,0,0xab,3,0x4c,0,0xad,3,0x4e);
  vpatch(rom,0x15b4,0x43,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,
         0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,
         0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0xb4);
  vpatch(rom,0x15fe,1,0x35);
  vpatch(rom,0x16b4,0x43,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,
         0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,
         0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0xb8);
  vpatch(rom,0x16fe,1,0x45);
  vpatch(rom,0x1a8b,3,0x30,0x19,0x11);
  vpatch(rom,0x12300,0x80,0x60,0x65,0x73,0x5f,0x71,0x6f,0x47,0x5f,0x27,0x2a,0x3d,0x11,0x3e,0x32,10,
         0x18,4,0xa4,0xcc,0xf8,0x8c,0xf4,0xe0,0xf8,0xe4,0x54,0xbc,0x88,0x7c,0x4c,0x50,0x18,0x5f,0x1f
         ,0x7f,7,7,0x1f,0,0,0xae,0xef,0x9f,0x59,0x5f,0x1f,0xe,0,0xff,0xff,0xff,0xff,0xff,0xff,0xf0,0
         ,0x78,0xfb,0xfa,0x82,0xe3,0x70,0,0xf0,0x20);
  vpatch(rom,0x12400,0x180,0x20,0x2b,0x3c,0x3f,0x28,0x2f,0x2f,0x2f,7,4,0x1b,0x18,0x17,4,4,0,0x40,
         0xe0,0xd0,200,0xf0,0x40,0x80,0,0xe0,0x50,0xe8,0xf0,200,0xf8,0x70,0xe0,7,0x3f,0x3f,0xf,0x1f,
         0x1f,0x1e,0,0x75,0x4f,0x4f,0x28,0x3f,0x1f,0,0x3c,0xf0,0xf8,0xf8,0xf8,0xf8,0xf8,0x18,0,0x80,
         0x70,0x50,0x50,0x70,0x80,0x60,0,0);
  return;
}

Assistant:

static void dw4_hero(dw_rom *rom)
{
    vpatch(rom, 0x013b4,   79,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57);
    vpatch(rom, 0x014b4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014d4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014f4,   13,  0x48,  0x00,  0xa9,  0x03,  0x4a,  0x00,  0xab,  0x03,  0x4c,  0x00,  0xad,  0x03,  0x4e);
    vpatch(rom, 0x015b4,   67,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0xb4,  0x03,  0x31);
    vpatch(rom, 0x015fe,    1,  0x35);
    vpatch(rom, 0x016b4,   67,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0xb8,  0x03,  0x41);
    vpatch(rom, 0x016fe,    1,  0x45);
    vpatch(rom, 0x01a8b,    3,  0x30,  0x19,  0x11);
    vpatch(rom, 0x12300,  128,  0x60,  0x65,  0x73,  0x5f,  0x71,  0x6f,  0x47,  0x5f,  0x27,  0x2a,  0x3d,  0x11,  0x3e,  0x32,  0x0a,  0x18,  0x04,  0xa4,  0xcc,  0xf8,  0x8c,  0xf4,  0xe0,  0xf8,  0xe4,  0x54,  0xbc,  0x88,  0x7c,  0x4c,  0x50,  0x18,  0x5f,  0x1f,  0x7f,  0x07,  0x07,  0x1f,  0x00,  0x00,  0xae,  0xef,  0x9f,  0x59,  0x5f,  0x1f,  0x0e,  0x00,  0xff,  0xff,  0xff,  0xff,  0xff,  0xff,  0xf0,  0x00,  0x78,  0xfb,  0xfa,  0x82,  0xe3,  0x70,  0x00,  0xf0,  0x20,  0x25,  0x33,  0x1f,  0x71,  0x6f,  0x47,  0x5f,  0x27,  0x2a,  0x3d,  0x11,  0x3e,  0x32,  0x0a,  0x18,  0x04,  0xa4,  0xcc,  0xf8,  0x8c,  0xf4,  0xe0,  0xf8,  0xe4,  0x54,  0xbc,  0x88,  0x7c,  0x4c,  0x50,  0x18,  0x7f,  0x5f,  0x5f,  0x03,  0x03,  0x1f,  0x0f,  0x00,  0x1e,  0xaf,  0xaf,  0xed,  0x4f,  0x1e,  0x00,  0x0f,  0xfc,  0xfe,  0xfe,  0xfe,  0xfe,  0xfc,  0x00,  0x00,  0x60,  0xdc,  0xd4,  0xd4,  0xdc,  0xe0,  0x70,  0x00);
    vpatch(rom, 0x12400,  384,  0x20,  0x2b,  0x3c,  0x3f,  0x28,  0x2f,  0x2f,  0x2f,  0x07,  0x04,  0x1b,  0x18,  0x17,  0x04,  0x04,  0x00,  0x40,  0xe0,  0xd0,  0xc8,  0xf0,  0x40,  0x80,  0x00,  0xe0,  0x50,  0xe8,  0xf0,  0xc8,  0xf8,  0x70,  0xe0,  0x07,  0x3f,  0x3f,  0x0f,  0x1f,  0x1f,  0x1e,  0x00,  0x75,  0x4f,  0x4f,  0x28,  0x3f,  0x1f,  0x00,  0x3c,  0xf0,  0xf8,  0xf8,  0xf8,  0xf8,  0xf8,  0x18,  0x00,  0x80,  0x70,  0x50,  0x50,  0x70,  0x80,  0x60,  0x00,  0x00,  0x0b,  0x1c,  0x1f,  0x88,  0xcf,  0x6f,  0x3f,  0x07,  0x04,  0x1b,  0x18,  0x17,  0x04,  0x04,  0x00,  0x40,  0xe0,  0xd0,  0xc8,  0xf0,  0x40,  0x80,  0x00,  0xe0,  0x50,  0xe8,  0xf0,  0xc8,  0xf8,  0x70,  0xe0,  0x1f,  0x1f,  0x1f,  0x1f,  0x1f,  0x1f,  0x00,  0x00,  0x03,  0x19,  0x08,  0x08,  0x1b,  0x07,  0x1c,  0x01,  0xe0,  0xf0,  0xf0,  0xf0,  0xf8,  0xf8,  0xf8,  0x00,  0xe0,  0x30,  0x30,  0x00,  0x88,  0xc0,  0x00,  0xe0,  0x02,  0x07,  0x0b,  0x13,  0x0f,  0x02,  0x01,  0x00,  0x07,  0x0a,  0x17,  0x0f,  0x13,  0x1f,  0x0e,  0x07,  0x04,  0xd4,  0x3c,  0xfc,  0x14,  0xf4,  0xf4,  0xf4,  0xe0,  0x20,  0xd8,  0x18,  0xe8,  0x20,  0x20,  0x00,  0x0f,  0x1f,  0x1f,  0x0f,  0x1f,  0x1f,  0x0f,  0x00,  0x07,  0x0f,  0x0f,  0x00,  0x1f,  0x1f,  0x00,  0x07,  0xe0,  0xfc,  0xfc,  0xf8,  0xc8,  0xf8,  0x00,  0x00,  0xae,  0x32,  0x02,  0x8c,  0xfc,  0xf8,  0x38,  0x80,  0x02,  0x07,  0x0b,  0x13,  0x0f,  0x02,  0x01,  0x00,  0x07,  0x0a,  0x17,  0x0f,  0x13,  0x1f,  0x0e,  0x07,  0x00,  0xd0,  0x38,  0xf8,  0x11,  0xf3,  0xf6,  0xfc,  0xe0,  0x20,  0xd8,  0x18,  0xe8,  0x20,  0x20,  0x00,  0x07,  0x0f,  0x0f,  0x0f,  0x1f,  0x1f,  0x00,  0x00,  0x07,  0x0c,  0x0c,  0x00,  0x1e,  0x1f,  0x0e,  0x00,  0xf8,  0xf8,  0x78,  0xa8,  0xa0,  0x78,  0x78,  0x00,  0xe0,  0xc0,  0x90,  0x70,  0x78,  0xf8,  0x00,  0x3c,  0x20,  0x24,  0x32,  0x17,  0x38,  0x20,  0x00,  0x1c,  0x27,  0x2b,  0x3d,  0x18,  0x27,  0x3f,  0x0f,  0x1b,  0x06,  0x26,  0x4e,  0xea,  0x1e,  0x06,  0x02,  0x3a,  0xe4,  0xd4,  0xbc,  0x18,  0xe4,  0xfc,  0xf0,  0xd8,  0xff,  0xff,  0xff,  0xff,  0xff,  0xde,  0x0c,  0x00,  0x1e,  0xdf,  0x5f,  0x40,  0xc7,  0x02,  0x02,  0x00,  0xf8,  0xfe,  0xfe,  0xf8,  0xf8,  0xf8,  0xf0,  0x00,  0x77,  0xf1,  0xf1,  0x03,  0xfa,  0xf8,  0x00,  0xf0,  0x20,  0x24,  0x32,  0x17,  0x38,  0x20,  0x00,  0x1c,  0x27,  0x2b,  0x3d,  0x18,  0x27,  0x3f,  0x0f,  0x1b,  0x04,  0x24,  0x4c,  0xe8,  0x1e,  0x06,  0x02,  0x3a,  0xe4,  0xd4,  0xbc,  0x18,  0xe4,  0xfc,  0xf0,  0xd8,  0x3f,  0x7f,  0x7f,  0x7f,  0x3f,  0x1f,  0x0f,  0x00,  0x1e,  0x3f,  0x3f,  0x20,  0x07,  0x03,  0x00,  0x07,  0xfa,  0xf8,  0xfe,  0xfc,  0xf8,  0x78,  0x00,  0x00,  0x70,  0xe7,  0xe1,  0x03,  0xfa,  0x78,  0x70,  0x00);
}